

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_f105d::BuildFileImpl::parseRootNode(BuildFileImpl *this,Node *node)

{
  bool bVar1;
  uint uVar2;
  KeyValueNode *pKVar3;
  Node *pNVar4;
  MappingNode *pMVar5;
  ScalarNode *entry;
  bool local_389;
  bool local_351;
  bool local_319;
  bool local_2e1;
  bool local_2a9;
  StringRef local_240;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_230;
  StringRef local_228;
  StringRef local_218;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_208;
  StringRef local_200;
  StringRef local_1f0;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_1e0;
  StringRef local_1d8;
  StringRef local_1c8;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_1b8;
  StringRef local_1b0;
  StringRef local_1a0;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_190;
  StringRef local_188;
  StringRef local_178;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_168;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode> local_130;
  iterator it;
  MappingNode *mapping;
  MappingNode *local_110;
  Node *node_local;
  BuildFileImpl *this_local;
  char *local_f8;
  MappingNode **local_f0;
  char *local_e8;
  StringRef *local_e0;
  char *local_d8;
  StringRef *local_d0;
  char *local_c8;
  StringRef *local_c0;
  char *local_b8;
  StringRef *local_b0;
  char *local_a8;
  StringRef *local_a0;
  char *local_98;
  StringRef *local_90;
  char *local_88;
  StringRef *local_80;
  char *local_78;
  StringRef *local_70;
  char *local_68;
  StringRef *local_60;
  char *local_58;
  StringRef *local_50;
  char *local_48;
  StringRef *local_40;
  char *local_38;
  StringRef *local_30;
  char *local_28;
  StringRef *local_20;
  char *local_18;
  StringRef *local_10;
  
  local_110 = (MappingNode *)node;
  node_local = (Node *)this;
  uVar2 = llvm::yaml::Node::getType(node);
  pMVar5 = local_110;
  if (uVar2 == 4) {
    it.Base = local_110;
    local_130.Base = (MappingNode *)llvm::yaml::MappingNode::begin(local_110);
    pKVar3 = llvm::yaml::
             basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
             operator->(&local_130);
    pNVar4 = llvm::yaml::KeyValueNode::getKey(pKVar3);
    local_e0 = &local_140;
    local_e8 = "client";
    strlen("client");
    bVar1 = nodeIsScalarString(this,pNVar4,local_140);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pKVar3 = llvm::yaml::
               basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
               operator->(&local_130);
      pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
      uVar2 = llvm::yaml::Node::getType(pNVar4);
      if (uVar2 == 4) {
        pKVar3 = llvm::yaml::
                 basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                 operator->(&local_130);
        pMVar5 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
        bVar1 = parseClientMapping(this,pMVar5);
        if (bVar1) {
          llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
          operator++(&local_130);
          local_168.Base = (MappingNode *)llvm::yaml::MappingNode::end(it.Base);
          bVar1 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator!=(&local_130,&local_168);
          local_2a9 = false;
          if (bVar1) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getKey(pKVar3);
            local_b0 = &local_178;
            local_b8 = "tools";
            strlen("tools");
            local_2a9 = nodeIsScalarString(this,pNVar4,local_178);
          }
          if (local_2a9 != false) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
            uVar2 = llvm::yaml::Node::getType(pNVar4);
            if (uVar2 != 4) {
              pKVar3 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator->(&local_130);
              pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
              local_a0 = &local_188;
              local_a8 = "unexpected \'tools\' value (expected map)";
              strlen("unexpected \'tools\' value (expected map)");
              error(this,pNVar4,local_188);
              return false;
            }
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pMVar5 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
            bVar1 = parseToolsMapping(this,pMVar5);
            if (!bVar1) {
              return false;
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&local_130);
          }
          local_190.Base = (MappingNode *)llvm::yaml::MappingNode::end(it.Base);
          bVar1 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator!=(&local_130,&local_190);
          local_2e1 = false;
          if (bVar1) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getKey(pKVar3);
            local_90 = &local_1a0;
            local_98 = "targets";
            strlen("targets");
            local_2e1 = nodeIsScalarString(this,pNVar4,local_1a0);
          }
          if (local_2e1 != false) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
            uVar2 = llvm::yaml::Node::getType(pNVar4);
            if (uVar2 != 4) {
              pKVar3 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator->(&local_130);
              pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
              local_80 = &local_1b0;
              local_88 = "unexpected \'targets\' value (expected map)";
              strlen("unexpected \'targets\' value (expected map)");
              error(this,pNVar4,local_1b0);
              return false;
            }
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pMVar5 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
            bVar1 = parseTargetsMapping(this,pMVar5);
            if (!bVar1) {
              return false;
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&local_130);
          }
          local_1b8.Base = (MappingNode *)llvm::yaml::MappingNode::end(it.Base);
          bVar1 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator!=(&local_130,&local_1b8);
          local_319 = false;
          if (bVar1) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getKey(pKVar3);
            local_70 = &local_1c8;
            local_78 = "default";
            strlen("default");
            local_319 = nodeIsScalarString(this,pNVar4,local_1c8);
          }
          if (local_319 != false) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
            uVar2 = llvm::yaml::Node::getType(pNVar4);
            if (uVar2 != 1) {
              pKVar3 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator->(&local_130);
              pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
              local_60 = &local_1d8;
              local_68 = "unexpected \'default\' target value (expected scalar)";
              strlen("unexpected \'default\' target value (expected scalar)");
              error(this,pNVar4,local_1d8);
              return false;
            }
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            entry = (ScalarNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
            bVar1 = parseDefaultTarget(this,entry);
            if (!bVar1) {
              return false;
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&local_130);
          }
          local_1e0.Base = (MappingNode *)llvm::yaml::MappingNode::end(it.Base);
          bVar1 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator!=(&local_130,&local_1e0);
          local_351 = false;
          if (bVar1) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getKey(pKVar3);
            local_50 = &local_1f0;
            local_58 = "nodes";
            strlen("nodes");
            local_351 = nodeIsScalarString(this,pNVar4,local_1f0);
          }
          if (local_351 != false) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
            uVar2 = llvm::yaml::Node::getType(pNVar4);
            if (uVar2 != 4) {
              pKVar3 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator->(&local_130);
              pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
              local_40 = &local_200;
              local_48 = "unexpected \'nodes\' value (expected map)";
              strlen("unexpected \'nodes\' value (expected map)");
              error(this,pNVar4,local_200);
              return false;
            }
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pMVar5 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
            bVar1 = parseNodesMapping(this,pMVar5);
            if (!bVar1) {
              return false;
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&local_130);
          }
          local_208.Base = (MappingNode *)llvm::yaml::MappingNode::end(it.Base);
          bVar1 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator!=(&local_130,&local_208);
          local_389 = false;
          if (bVar1) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getKey(pKVar3);
            local_30 = &local_218;
            local_38 = "commands";
            strlen("commands");
            local_389 = nodeIsScalarString(this,pNVar4,local_218);
          }
          if (local_389 != false) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
            uVar2 = llvm::yaml::Node::getType(pNVar4);
            if (uVar2 != 4) {
              pKVar3 = llvm::yaml::
                       basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator->(&local_130);
              pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
              local_20 = &local_228;
              local_28 = "unexpected \'commands\' value (expected map)";
              strlen("unexpected \'commands\' value (expected map)");
              error(this,pNVar4,local_228);
              return false;
            }
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator->(&local_130);
            pMVar5 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar3);
            bVar1 = parseCommandsMapping(this,pMVar5);
            if (!bVar1) {
              return false;
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&local_130);
          }
          local_230.Base = (MappingNode *)llvm::yaml::MappingNode::end(it.Base);
          bVar1 = llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator!=(&local_130,&local_230);
          if (bVar1) {
            pKVar3 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator*(&local_130);
            local_10 = &local_240;
            local_18 = "unexpected trailing top-level section";
            strlen("unexpected trailing top-level section");
            error(this,&pKVar3->super_Node,local_240);
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        pKVar3 = llvm::yaml::
                 basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                 operator->(&local_130);
        pNVar4 = llvm::yaml::KeyValueNode::getValue(pKVar3);
        local_c0 = &local_160;
        local_c8 = "unexpected \'client\' value (expected map)";
        strlen("unexpected \'client\' value (expected map)");
        error(this,pNVar4,local_160);
        this_local._7_1_ = false;
      }
    }
    else {
      pKVar3 = llvm::yaml::
               basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
               operator->(&local_130);
      pNVar4 = llvm::yaml::KeyValueNode::getKey(pKVar3);
      local_d0 = &local_150;
      local_d8 = "expected initial mapping key \'client\'";
      strlen("expected initial mapping key \'client\'");
      error(this,pNVar4,local_150);
      this_local._7_1_ = false;
    }
  }
  else {
    local_f0 = &mapping;
    local_f8 = "unexpected top-level node";
    strlen("unexpected top-level node");
    error(this,&pMVar5->super_Node,_mapping);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parseRootNode(llvm::yaml::Node* node) {
    // The root must always be a mapping.
    if (node->getType() != llvm::yaml::Node::NK_Mapping) {
      error(node, "unexpected top-level node");
      return false;
    }
    auto mapping = static_cast<llvm::yaml::MappingNode*>(node);

    // Iterate over each of the sections in the mapping.
    auto it = mapping->begin();
    if (!nodeIsScalarString(it->getKey(), "client")) {
      error(it->getKey(), "expected initial mapping key 'client'");
      return false;
    }
    if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
      error(it->getValue(), "unexpected 'client' value (expected map)");
      return false;
    }

    // Parse the client mapping.
    if (!parseClientMapping(
            static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
      return false;
    }
    ++it;

    // Parse the tools mapping, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "tools")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(it->getValue(), "unexpected 'tools' value (expected map)");
        return false;
      }

      if (!parseToolsMapping(
              static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // Parse the targets mapping, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "targets")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(it->getValue(), "unexpected 'targets' value (expected map)");
        return false;
      }

      if (!parseTargetsMapping(
              static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // Parse the default target, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "default")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(it->getValue(), "unexpected 'default' target value (expected scalar)");
        return false;
      }

      if (!parseDefaultTarget(
              static_cast<llvm::yaml::ScalarNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // Parse the nodes mapping, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "nodes")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(it->getValue(), "unexpected 'nodes' value (expected map)");
        return false;
      }

      if (!parseNodesMapping(
              static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // Parse the commands mapping, if present.
    if (it != mapping->end() && nodeIsScalarString(it->getKey(), "commands")) {
      if (it->getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(it->getValue(), "unexpected 'commands' value (expected map)");
        return false;
      }

      if (!parseCommandsMapping(
              static_cast<llvm::yaml::MappingNode*>(it->getValue()))) {
        return false;
      }
      ++it;
    }

    // There shouldn't be any trailing sections.
    if (it != mapping->end()) {
      error(&*it, "unexpected trailing top-level section");
      return false;
    }

    return true;
  }